

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::runInternal(Session *this)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  unsigned_long *puVar4;
  int *piVar5;
  exception *ex;
  undefined1 local_2c0 [8];
  Totals totals;
  TestGroup tests;
  undefined1 local_38 [8];
  Option<unsigned_long> listed;
  Session *this_local;
  
  if ((this->m_startupExceptions & 1U) == 0) {
    if ((((this->m_configData).showHelp & 1U) == 0) &&
       (((this->m_configData).libIdentify & 1U) == 0)) {
      config(this);
      peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_config);
      seedRng(&peVar3->super_IConfig);
      if (((this->m_configData).filenamesAsTags & 1U) != 0) {
        peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_config);
        anon_unknown_1::applyFilenamesAsTags(&peVar3->super_IConfig);
      }
      list((Catch *)local_38,&this->m_config);
      bVar1 = Option::operator_cast_to_bool((Option *)local_38);
      if (bVar1) {
        puVar4 = Option<unsigned_long>::operator*((Option<unsigned_long> *)local_38);
        this_local._4_4_ = (int)*puVar4;
      }
      Option<unsigned_long>::~Option((Option<unsigned_long> *)local_38);
      if (!bVar1) {
        anon_unknown_1::TestGroup::TestGroup
                  ((TestGroup *)&totals.testCases.failedButOk,&this->m_config);
        anon_unknown_1::TestGroup::execute
                  ((Totals *)local_2c0,(TestGroup *)&totals.testCases.failedButOk);
        peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_config);
        uVar2 = (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
        if (((uVar2 & 1) == 0) || (local_2c0._0_4_ != -1)) {
          ex._4_4_ = (undefined4)totals.assertions.passed;
          piVar5 = std::max<int>((int *)local_2c0,(int *)((long)&ex + 4));
          piVar5 = std::min<int>(&(anonymous_namespace)::MaxExitCode,piVar5);
          this_local._4_4_ = *piVar5;
        }
        else {
          this_local._4_4_ = 2;
        }
        anon_unknown_1::TestGroup::~TestGroup((TestGroup *)&totals.testCases.failedButOk);
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }